

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::OutputBuiltIn::Run(OutputBuiltIn *this)

{
  GLenum *pGVar1;
  GLint *pGVar2;
  uint uVar3;
  long lVar4;
  undefined8 src_vs;
  GLuint program;
  mapped_type *pmVar5;
  long error;
  GLenum props [12];
  GLint expected [12];
  GLint expected2 [12];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indices;
  key_type local_50;
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(&indices,this);
  src_vs = indices._M_t._M_impl._0_8_;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(props,this);
  program = PIQBase::CreateProgram((PIQBase *)this,(char *)src_vs,(char *)props._0_8_,true);
  pGVar1 = props + 4;
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  if ((_Base_ptr *)indices._M_t._M_impl._0_8_ !=
      &indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)indices._M_t._M_impl._0_8_,
                    (ulong)((long)&(indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                   ->_M_color + 1));
  }
  error = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e4,0x92f5,2,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e4,0x92f6,0x11,&error);
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indices._M_t._M_impl.super__Rb_tree_header._M_header;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  props._0_8_ = pGVar1;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_FragDepth","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_SampleMask[0]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_FragDepth","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar5;
  pGVar2 = expected + 4;
  expected._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected,"gl_FragDepth","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar3,expected,&error);
  if ((GLint *)expected._0_8_ != pGVar2) {
    operator_delete((void *)expected._0_8_,expected._16_8_ + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_SampleMask[0]","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar5;
  expected._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected,"gl_SampleMask[0]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar3,expected,&error);
  if ((GLint *)expected._0_8_ != pGVar2) {
    operator_delete((void *)expected._0_8_,expected._16_8_ + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_FragDepth","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,props,0xffffffff,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_SampleMask","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,props,0xffffffff,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_SampleMask[0]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,props,0xffffffff,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_FragDepth","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x14])(this,(ulong)program,0x92e4,props,0xffffffff,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_SampleMask","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x14])(this,(ulong)program,0x92e4,props,0xffffffff,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_SampleMask[0]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x14])(this,(ulong)program,0x92e4,props,0xffffffff,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props[8] = 0x9306;
  props[9] = 0x930e;
  props[10] = 0x92e7;
  props[0xb] = 0x930f;
  props[4] = 0x930a;
  props[5] = 0x9309;
  props[6] = 0x9307;
  props[7] = 0x9308;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x930b;
  expected[6] = 0;
  expected[7] = 0;
  expected[0] = 0xd;
  expected[1] = 0x1406;
  expected[2] = 1;
  expected[3] = 0;
  expected[4] = 1;
  expected[5] = 0;
  expected[8] = 0;
  expected[9] = -1;
  expected[10] = 0;
  expected[0xb] = -1;
  expected2._0_8_ = expected2 + 4;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected2,"gl_FragDepth","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)expected2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e4,(ulong)*pmVar5,0xc,props,0xc,expected,&error);
  if ((GLint *)expected2._0_8_ != expected2 + 4) {
    operator_delete((void *)expected2._0_8_,expected2._16_8_ + 1);
  }
  expected2[6] = 0;
  expected2[7] = 0;
  expected2[0] = 0x11;
  expected2[1] = 0x1404;
  expected2[2] = 1;
  expected2[3] = 0;
  expected2[4] = 1;
  expected2[5] = 0;
  expected2[8] = 0;
  expected2[9] = -1;
  expected2[10] = 0;
  expected2[0xb] = -1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"gl_SampleMask[0]","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_50);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e4,(ulong)*pmVar5,0xc,props,0xc,(key_type *)expected2,&error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,program);
  lVar4 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indices._M_t);
  return lVar4;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), true);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_ACTIVE_RESOURCES, 2, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_MAX_NAME_LENGTH, 17, error);

		std::map<std::string, GLuint> indices;
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, indices, "gl_FragDepth", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, indices, "gl_SampleMask[0]", error);

		VerifyGetProgramResourceName(program, GL_PROGRAM_OUTPUT, indices["gl_FragDepth"], "gl_FragDepth", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_OUTPUT, indices["gl_SampleMask[0]"], "gl_SampleMask[0]",
									 error);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "gl_FragDepth", -1, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "gl_SampleMask", -1, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "gl_SampleMask[0]", -1, error);

		// spec is not clear what to require here
		VerifyGetProgramResourceLocationIndex(program, GL_PROGRAM_OUTPUT, "gl_FragDepth", -1, error);
		VerifyGetProgramResourceLocationIndex(program, GL_PROGRAM_OUTPUT, "gl_SampleMask", -1, error);
		VerifyGetProgramResourceLocationIndex(program, GL_PROGRAM_OUTPUT, "gl_SampleMask[0]", -1, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_GEOMETRY_SHADER,
						   GL_REFERENCED_BY_TESS_CONTROL_SHADER,
						   GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION,
						   GL_IS_PER_PATCH,
						   GL_LOCATION_INDEX };
		GLint expected[] = { 13, GL_FLOAT, 1, 0, 1, 0, 0, 0, 0, -1, 0, -1 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, indices["gl_FragDepth"], 12, props, 12, expected, error);
		GLint expected2[] = { 17, GL_INT, 1, 0, 1, 0, 0, 0, 0, -1, 0, -1 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, indices["gl_SampleMask[0]"], 12, props, 12, expected2,
								   error);

		glDeleteProgram(program);
		return error;
	}